

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char * kj::_::
       fill<kj::ArrayPtr<unsigned_char>,kj::StringPtr&,kj::_::Delimited<kj::ArrayPtr<unsigned_char>>>
                 (char *target,Delimited<kj::ArrayPtr<unsigned_char>_> *first,StringPtr *rest,
                 Delimited<kj::ArrayPtr<unsigned_char>_> *rest_1)

{
  char *pcVar1;
  
  pcVar1 = Delimited<kj::ArrayPtr<unsigned_char>_>::flattenTo(first,target);
  pcVar1 = fill<kj::StringPtr,kj::_::Delimited<kj::ArrayPtr<unsigned_char>>>(pcVar1,rest,rest_1);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, Delimited<T>&& first, Rest&&... rest) {
  target = first.flattenTo(target);
  return fill(target, kj::fwd<Rest>(rest)...);
}